

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts3PendingTermsFlush(Fts3Table *p)

{
  bool bVar1;
  int iVar2;
  sqlite3_stmt *local_20;
  sqlite3_stmt *pStmt;
  int i;
  int rc;
  Fts3Table *p_local;
  
  pStmt._4_4_ = 0;
  pStmt._0_4_ = 0;
  _i = p;
  while( true ) {
    bVar1 = false;
    if (pStmt._4_4_ == 0) {
      bVar1 = (int)pStmt < _i->nIndex;
    }
    if (!bVar1) break;
    pStmt._4_4_ = fts3SegmentMerge(_i,_i->iPrevLangid,(int)pStmt,-1);
    if (pStmt._4_4_ == 0x65) {
      pStmt._4_4_ = 0;
    }
    pStmt._0_4_ = (int)pStmt + 1;
  }
  sqlite3Fts3PendingTermsClear(_i);
  if ((((pStmt._4_4_ == 0) && (_i->bHasStat != '\0')) && (_i->nAutoincrmerge == 0xff)) &&
     (_i->nLeafAdd != 0)) {
    local_20 = (sqlite3_stmt *)0x0;
    pStmt._4_4_ = fts3SqlStmt(_i,0x16,&local_20,(sqlite3_value **)0x0);
    if (pStmt._4_4_ == 0) {
      sqlite3_bind_int(local_20,1,2);
      pStmt._4_4_ = sqlite3_step(local_20);
      if (pStmt._4_4_ == 100) {
        iVar2 = sqlite3_column_int(local_20,0);
        _i->nAutoincrmerge = iVar2;
        if (_i->nAutoincrmerge == 1) {
          _i->nAutoincrmerge = 8;
        }
      }
      else if (pStmt._4_4_ == 0x65) {
        _i->nAutoincrmerge = 0;
      }
      pStmt._4_4_ = sqlite3_reset(local_20);
    }
  }
  return pStmt._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3PendingTermsFlush(Fts3Table *p){
  int rc = SQLITE_OK;
  int i;
        
  for(i=0; rc==SQLITE_OK && i<p->nIndex; i++){
    rc = fts3SegmentMerge(p, p->iPrevLangid, i, FTS3_SEGCURSOR_PENDING);
    if( rc==SQLITE_DONE ) rc = SQLITE_OK;
  }
  sqlite3Fts3PendingTermsClear(p);

  /* Determine the auto-incr-merge setting if unknown.  If enabled,
  ** estimate the number of leaf blocks of content to be written
  */
  if( rc==SQLITE_OK && p->bHasStat
   && p->nAutoincrmerge==0xff && p->nLeafAdd>0
  ){
    sqlite3_stmt *pStmt = 0;
    rc = fts3SqlStmt(p, SQL_SELECT_STAT, &pStmt, 0);
    if( rc==SQLITE_OK ){
      sqlite3_bind_int(pStmt, 1, FTS_STAT_AUTOINCRMERGE);
      rc = sqlite3_step(pStmt);
      if( rc==SQLITE_ROW ){
        p->nAutoincrmerge = sqlite3_column_int(pStmt, 0);
        if( p->nAutoincrmerge==1 ) p->nAutoincrmerge = 8;
      }else if( rc==SQLITE_DONE ){
        p->nAutoincrmerge = 0;
      }
      rc = sqlite3_reset(pStmt);
    }
  }
  return rc;
}